

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::ErrorCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,ErrorCode code)

{
  char *pcVar1;
  char *pcVar2;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "OK";
    pcVar1 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "CANCELLED";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "INVALID_ARGS";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "INVALID_COMMAND";
    pcVar1 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "TIMEOUT";
    pcVar1 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "NOT_FOUND";
    pcVar1 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "SECURITY";
    pcVar1 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UNIMPLEMENTED";
    pcVar1 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "BAD_FORMAT";
    pcVar1 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "BUSY";
    pcVar1 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "OUT_OF_MEMORY";
    pcVar1 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "IO_ERROR";
    pcVar1 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "IO_BUSY";
    pcVar1 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ALREADY_EXISTS";
    pcVar1 = "";
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "ABORTED";
    pcVar1 = "";
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "INVALID_STATE";
    pcVar1 = "";
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "REJECTED";
    pcVar1 = "";
    break;
  case 0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "COAP_ERROR";
    pcVar1 = "";
    break;
  case 0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "REGISTRY_ERROR";
    pcVar1 = "";
    break;
  case 0x13:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
    break;
  default:
    abort();
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ErrorCodeToString(ErrorCode code)
{
    switch (code)
    {
    case ErrorCode::kNone:
        return "OK";
    case ErrorCode::kCancelled:
        return "CANCELLED";
    case ErrorCode::kInvalidArgs:
        return "INVALID_ARGS";
    case ErrorCode::kInvalidCommand:
        return "INVALID_COMMAND";
    case ErrorCode::kTimeout:
        return "TIMEOUT";
    case ErrorCode::kNotFound:
        return "NOT_FOUND";
    case ErrorCode::kSecurity:
        return "SECURITY";
    case ErrorCode::kUnimplemented:
        return "UNIMPLEMENTED";
    case ErrorCode::kBadFormat:
        return "BAD_FORMAT";
    case ErrorCode::kBusy:
        return "BUSY";
    case ErrorCode::kOutOfMemory:
        return "OUT_OF_MEMORY";
    case ErrorCode::kIOError:
        return "IO_ERROR";
    case ErrorCode::kIOBusy:
        return "IO_BUSY";
    case ErrorCode::kAlreadyExists:
        return "ALREADY_EXISTS";
    case ErrorCode::kAborted:
        return "ABORTED";
    case ErrorCode::kInvalidState:
        return "INVALID_STATE";
    case ErrorCode::kRejected:
        return "REJECTED";
    case ErrorCode::kCoapError:
        return "COAP_ERROR";
    case ErrorCode::kRegistryError:
        return "REGISTRY_ERROR";
    case ErrorCode::kUnknown:
        return "UNKNOWN";

    default:
        VerifyOrDie(false);
        return "UNKNOWN";
    }
}